

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O2

FUNCTION_RETURN getModuleName(char *buffer)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  FUNCTION_RETURN FVar5;
  char pidStr [64];
  char proc_path [4096];
  char path [4096];
  
  FVar5 = FUNC_RET_OK;
  memset(path,0,0x1000);
  uVar1 = getpid();
  sprintf(pidStr,"%d",(ulong)uVar1);
  builtin_strncpy(proc_path,"/proc/",7);
  strcat(proc_path,pidStr);
  sVar3 = strlen(proc_path);
  builtin_strncpy(proc_path + sVar3,"/exe",5);
  sVar4 = readlink(proc_path,path,0xfff);
  iVar2 = (int)sVar4;
  if (iVar2 == -1) {
    FVar5 = FUNC_RET_ERROR;
  }
  else {
    path[iVar2] = '\0';
    strncpy(buffer,path,(long)iVar2);
  }
  return FVar5;
}

Assistant:

FUNCTION_RETURN getModuleName(char buffer[MAX_PATH]) {
	FUNCTION_RETURN result;
	char path[MAX_PATH] = { 0 };
	char proc_path[MAX_PATH], pidStr[64];
	pid_t pid = getpid();
	sprintf(pidStr, "%d", pid);
	strcpy(proc_path, "/proc/");
	strcat(proc_path, pidStr);
	strcat(proc_path, "/exe");

	int ch = readlink(proc_path, path, MAX_PATH-1);
	if (ch != -1) {
		path[ch] = '\0';
		strncpy(buffer, path, ch);
		result = FUNC_RET_OK;
	} else {
		result = FUNC_RET_ERROR;
	}
	return result;
}